

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::SwapCoordinates(ON_NurbsSurface *this,int i,int j)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  int local_20;
  bool local_19;
  int k;
  bool rc;
  int j_local;
  int i_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  local_19 = true;
  if (this->m_cv_count[1] < this->m_cv_count[0]) {
    for (local_20 = 0; local_20 < this->m_cv_count[1]; local_20 = local_20 + 1) {
      iVar1 = this->m_cv_count[0];
      iVar2 = this->m_cv_stride[0];
      pdVar4 = CV(this,0,local_20);
      bVar3 = ON_SwapPointListCoordinates(iVar1,iVar2,pdVar4,i,j);
      if (!bVar3) {
        local_19 = false;
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < this->m_cv_count[0]; local_20 = local_20 + 1) {
      iVar1 = this->m_cv_count[1];
      iVar2 = this->m_cv_stride[1];
      pdVar4 = CV(this,local_20,0);
      bVar3 = ON_SwapPointListCoordinates(iVar1,iVar2,pdVar4,i,j);
      if (!bVar3) {
        local_19 = false;
      }
    }
  }
  return local_19;
}

Assistant:

bool
ON_NurbsSurface::SwapCoordinates( int i, int j )
{
  DestroySurfaceTree();
  bool rc = true;
  int k;
  if ( m_cv_count[0] <= m_cv_count[1] ) {
    for ( k = 0; k < m_cv_count[0]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[1], m_cv_stride[1], CV(k,0), i, j ) )
        rc = false;
    }
  }
  else {
    for ( k = 0; k < m_cv_count[1]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[0], m_cv_stride[0], CV(0,k), i, j ) )
        rc = false;
    }
  }
  return rc;
}